

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O3

int pkey_rsa_copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  undefined4 *puVar3;
  BIGNUM *pBVar4;
  void *pvVar5;
  int iVar6;
  
  puVar3 = (undefined4 *)OPENSSL_zalloc(0x48);
  iVar6 = 0;
  if (puVar3 != (undefined4 *)0x0) {
    *puVar3 = 0x800;
    puVar3[4] = 1;
    puVar3[10] = 0xfffffffe;
    dst->data = puVar3;
    puVar1 = (undefined4 *)src->data;
    *puVar3 = *puVar1;
    if (*(BIGNUM **)(puVar1 + 2) != (BIGNUM *)0x0) {
      pBVar4 = BN_dup(*(BIGNUM **)(puVar1 + 2));
      *(BIGNUM **)(puVar3 + 2) = pBVar4;
      if (pBVar4 == (BIGNUM *)0x0) {
        return 0;
      }
    }
    puVar3[4] = puVar1[4];
    uVar2 = *(undefined8 *)(puVar1 + 8);
    *(undefined8 *)(puVar3 + 6) = *(undefined8 *)(puVar1 + 6);
    *(undefined8 *)(puVar3 + 8) = uVar2;
    puVar3[10] = puVar1[10];
    if (*(long *)(puVar1 + 0xe) != 0) {
      OPENSSL_free(*(void **)(puVar3 + 0xe));
      pvVar5 = OPENSSL_memdup(*(void **)(puVar1 + 0xe),*(size_t *)(puVar1 + 0x10));
      *(void **)(puVar3 + 0xe) = pvVar5;
      if (pvVar5 == (void *)0x0) {
        return 0;
      }
      *(undefined8 *)(puVar3 + 0x10) = *(undefined8 *)(puVar1 + 0x10);
    }
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

static int pkey_rsa_copy(EVP_PKEY_CTX *dst, EVP_PKEY_CTX *src) {
  RSA_PKEY_CTX *dctx, *sctx;
  if (!pkey_rsa_init(dst)) {
    return 0;
  }
  sctx = reinterpret_cast<RSA_PKEY_CTX *>(src->data);
  dctx = reinterpret_cast<RSA_PKEY_CTX *>(dst->data);
  dctx->nbits = sctx->nbits;
  if (sctx->pub_exp) {
    dctx->pub_exp = BN_dup(sctx->pub_exp);
    if (!dctx->pub_exp) {
      return 0;
    }
  }

  dctx->pad_mode = sctx->pad_mode;
  dctx->md = sctx->md;
  dctx->mgf1md = sctx->mgf1md;
  dctx->saltlen = sctx->saltlen;
  if (sctx->oaep_label) {
    OPENSSL_free(dctx->oaep_label);
    dctx->oaep_label = reinterpret_cast<uint8_t *>(
        OPENSSL_memdup(sctx->oaep_label, sctx->oaep_labellen));
    if (!dctx->oaep_label) {
      return 0;
    }
    dctx->oaep_labellen = sctx->oaep_labellen;
  }

  return 1;
}